

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void kj::
     ctor<capnp::compiler::Compiler::Node,kj::StringPtr&,capnp::compiler::Declaration::Which&,capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>::Reader&>
               (Node *location,StringPtr *params,Which *params_1,Reader *params_2)

{
  Which WVar1;
  ListElementCount LVar2;
  char *pcVar3;
  size_t sVar4;
  
  pcVar3 = (params->content).ptr;
  sVar4 = (params->content).size_;
  WVar1 = *params_1;
  LVar2 = (params_2->reader).elementCount;
  (location->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_resolve_0021cfb0;
  location->module = (CompiledModule *)0x0;
  (location->parent).ptr = (Node *)0x0;
  (location->declaration)._reader.segment = (SegmentReader *)0x0;
  (location->declaration)._reader.capTable = (CapTableReader *)0x0;
  (location->declaration)._reader.data = (void *)0x0;
  (location->declaration)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(location->declaration)._reader.pointers + 6) = 0;
  (location->declaration)._reader.nestingLimit = 0x7fffffff;
  location->id = (ulong)WVar1 + 1000;
  (location->displayName).content.ptr = pcVar3;
  (location->displayName).content.size_ = sVar4;
  location->kind = WVar1;
  location->genericParamCount = LVar2;
  location->isBuiltin = true;
  location->startByte = 0;
  location->endByte = 0;
  capnp::compiler::Compiler::Node::Content::Content(&location->guardedContent);
  location->inGetContent = false;
  (location->loadedFinalSchema).ptr.isSet = false;
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}